

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O2

void __thiscall StackSym::VerifyConstFlags(StackSym *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  uint lineNumber;
  
  uVar3 = *(uint *)&this->field_0x18;
  if ((uVar3 & 8) == 0) {
    if ((uVar3 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0xc1,"(!m_isIntConst)","!m_isIntConst");
      if (!bVar2) goto LAB_005b76b4;
      *puVar4 = 0;
      uVar3 = *(uint *)&this->field_0x18;
    }
    if ((uVar3 & 0x20) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0xc2,"(!m_isTaggableIntConst)","!m_isTaggableIntConst");
      if (!bVar2) goto LAB_005b76b4;
      *puVar4 = 0;
      uVar3 = *(uint *)&this->field_0x18;
    }
    if ((uVar3 >> 8 & 1) == 0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(!m_isFltConst)";
    message = "!m_isFltConst";
    lineNumber = 0xc3;
  }
  else {
    if ((uVar3 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0xb4,"(this->m_isSingleDef)","this->m_isSingleDef");
      if (!bVar2) goto LAB_005b76b4;
      *puVar4 = 0;
    }
    if ((this->field_5).m_instrDef == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0xb5,"(this->m_instrDef)","this->m_instrDef");
      if (!bVar2) goto LAB_005b76b4;
      *puVar4 = 0;
    }
    uVar3 = *(uint *)&this->field_0x18;
    if ((uVar3 & 0x10) == 0) {
      if ((uVar3 & 0x20) == 0) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      error = "(!m_isTaggableIntConst)";
      message = "!m_isTaggableIntConst";
      lineNumber = 0xbc;
    }
    else {
      if ((uVar3 >> 8 & 1) == 0) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      error = "(!m_isFltConst)";
      message = "!m_isFltConst";
      lineNumber = 0xb8;
    }
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                     ,lineNumber,error,message);
  if (bVar2) {
    *puVar4 = 0;
    return;
  }
LAB_005b76b4:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
StackSym::VerifyConstFlags() const
{
    if (m_isConst)
    {
        Assert(this->m_isSingleDef);
        Assert(this->m_instrDef);
        if (m_isIntConst)
        {
            Assert(!m_isFltConst);
        }
        else
        {
            Assert(!m_isTaggableIntConst);
        }
    }
    else
    {
        Assert(!m_isIntConst);
        Assert(!m_isTaggableIntConst);
        Assert(!m_isFltConst);
    }
}